

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void load_balancing(void)

{
  pointer piVar1;
  ostream *poVar2;
  bool need_to_balance;
  vector<double,_std::allocator<double>_> global_weights;
  vector<int,_std::allocator<int>_> optimal_partition;
  char local_79;
  vector<int,_std::allocator<int>_> local_78;
  double local_60;
  vector<int,_std::allocator<int>_> local_58;
  double local_40;
  vector<double,_std::allocator<double>_> local_38;
  vector<int,_std::allocator<int>_> local_20;
  
  local_79 = '\0';
  calculate_global_layer_weights();
  if (mpi_rank == 0) {
    local_60 = calculate_partition_imbalance(&local_38,&x0_sr,nx_ich);
    local_79 = balancing_threshold < local_60;
  }
  MPI_Bcast(&local_79,1,&ompi_mpi_cxx_bool,0,&ompi_mpi_comm_world);
  if (local_79 == '\x01') {
    std::vector<int,_std::allocator<int>_>::vector(&local_78,(long)n_sr,(allocator_type *)&local_20)
    ;
    if (mpi_rank == 0) {
      calculate_optimal_partition(&local_20,&local_38,n_sr,nx_ich);
      normalize_new_partition(&local_58,&x0_sr,&local_20,nx_ich);
      piVar1 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (piVar1 != (pointer)0x0) {
        operator_delete(piVar1);
      }
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_40 = calculate_partition_imbalance(&local_38,&local_78,nx_ich);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Load balancing: imbalance ",0x1a);
      poVar2 = std::ostream::_M_insert<double>(local_60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", after balancing ",0x12);
      poVar2 = std::ostream::_M_insert<double>(local_40);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    MPI_Bcast(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start,
              (ulong)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2,&ompi_mpi_int,0,
              &ompi_mpi_comm_world);
    resize_regions(&local_78);
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void load_balancing() {
    bool need_to_balance = false;
    
    auto global_weights = calculate_global_layer_weights();
    
    double initial_imbalance;
    if (mpi_rank == 0) {
        initial_imbalance = calculate_partition_imbalance(global_weights, x0_sr, nx_ich);

        need_to_balance = (initial_imbalance > balancing_threshold);
    }

    MPI_Bcast(&need_to_balance, 1, MPI_CXX_BOOL, 0, MPI_COMM_WORLD);

    if (need_to_balance) {
        std::vector<int> new_partition(n_sr);

        if (mpi_rank == 0) {
            auto optimal_partition = calculate_optimal_partition(global_weights, n_sr, nx_ich);
            new_partition = normalize_new_partition(x0_sr, optimal_partition, nx_ich);
            auto normalized_imbalance = calculate_partition_imbalance(global_weights, new_partition, nx_ich);

            cout << "Load balancing: imbalance " << initial_imbalance << ", after balancing " << normalized_imbalance << endl;
        }

        MPI_Bcast(new_partition.data(), new_partition.size(), MPI_INT, 0, MPI_COMM_WORLD);

        resize_regions(new_partition);
    }
}